

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdArgs.cpp
# Opt level: O2

void __thiscall asl::CmdArgs::parse(CmdArgs *this,int argc,char **argv,String *spec)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  anon_union_16_2_78e7fdac_for_String_2 *paVar4;
  String *pSVar5;
  Array<asl::String> *this_00;
  String *this_01;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  Array<asl::String> parts;
  Array<asl::String> options;
  Array<asl::String> flags;
  String opt;
  
  uVar8 = (ulong)(uint)-argc;
  if (0 < argc) {
    uVar8 = (ulong)(uint)argc;
  }
  for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    String::String(&opt,argv[uVar7]);
    Array<asl::String>::operator<<(&this->_args,&opt);
    String::~String(&opt);
  }
  Array<asl::String>::Array(&flags);
  Array<asl::String>::Array(&options);
  String::String(&opt,',');
  String::split((String *)&parts,spec);
  String::~String(&opt);
  for (uVar8 = (ulong)*(uint *)&parts._a[-1].field_2 << 0x20; iVar6 = (int)uVar8,
      iVar6 < (int)(uVar8 >> 0x20); uVar8 = uVar8 & 0xffffffff00000000 | (ulong)(iVar6 + 1)) {
    pSVar5 = parts._a + iVar6;
    bVar1 = String::contains(pSVar5,':');
    if (bVar1) {
      iVar3 = String::indexOf(pSVar5,':',0);
      String::substring(&opt,pSVar5,0,iVar3);
      Array<asl::String>::operator<<(&options,&opt);
      String::~String(&opt);
    }
    else {
      Array<asl::String>::operator<<(&flags,pSVar5);
    }
  }
  iVar6 = 1;
  while( true ) {
    pSVar5 = (this->_args)._a;
    if (*(int *)&pSVar5[-1].field_2 <= iVar6) break;
    if (pSVar5[iVar6]._size == 0) {
      paVar4 = &pSVar5[iVar6].field_2;
    }
    else {
      paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)pSVar5[iVar6].field_2._str;
    }
    if ((paVar4->_space[0] == '-') &&
       (((byte)(paVar4->_space[1] - 0x30U) < 10 ||
        ((byte)((paVar4->_space[1] & 0xdfU) + 0xbf) < 0x1a)))) {
LAB_0013da5f:
      bVar1 = String::endsWith(pSVar5 + iVar6,'!');
      pSVar5 = (this->_args)._a;
      String::substring(&opt,pSVar5 + iVar6,1,pSVar5[iVar6]._len - (uint)bVar1);
      bVar2 = Array<asl::String>::contains(&this->_unused,&opt);
      if (!bVar2) {
        Array<asl::String>::operator<<(&this->_unused,&opt);
      }
      pSVar5 = (this->_args)._a;
      if (iVar6 < *(int *)&pSVar5[-1].field_2 + -1) {
        iVar3 = iVar6 + 1;
        if (pSVar5[iVar3]._size == 0) {
          paVar4 = &pSVar5[iVar3].field_2;
        }
        else {
          paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)pSVar5[iVar3].field_2._str;
        }
        if ((paVar4->_space[0] != '-') ||
           (bVar2 = true, 0x19 < (byte)((paVar4->_space[1] & 0xdfU) + 0xbf))) {
          bVar2 = String::startsWith(pSVar5 + iVar3,"--");
          pSVar5 = (this->_args)._a;
          if (!bVar2) goto LAB_0013db08;
          if (pSVar5[iVar3]._size == 0) {
            paVar4 = &pSVar5[iVar3].field_2;
          }
          else {
            paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)pSVar5[iVar3].field_2._str;
          }
          bVar2 = (byte)((paVar4->_space[2] & 0xdfU) + 0xbf) < 0x1a;
        }
      }
      else {
LAB_0013db08:
        bVar2 = false;
      }
      if ((bVar2) || (*(int *)&pSVar5[-1].field_2 + -1 <= iVar6)) {
LAB_0013db3f:
        if (!bVar1) {
          bVar1 = Array<asl::String>::contains(&options,&opt);
          if (bVar1) {
            bVar1 = false;
            goto LAB_0013dbc0;
          }
        }
        pSVar5 = Map<asl::String,_asl::String>::operator[]
                           (&(this->_opts).super_Map<asl::String,_asl::String>,&opt);
        bVar1 = true;
        String::operator=(pSVar5,"1");
      }
      else {
        bVar2 = Array<asl::String>::contains(&flags,&opt);
        if (bVar2 || bVar1) goto LAB_0013db3f;
        this_00 = Map<asl::String,_asl::Array<asl::String>_>::operator[]
                            (&(this->_multi).super_Map<asl::String,_asl::Array<asl::String>_>,&opt);
        iVar6 = iVar6 + 1;
        Array<asl::String>::operator<<(this_00,(this->_args)._a + iVar6);
        pSVar5 = (this->_args)._a;
        this_01 = Map<asl::String,_asl::String>::operator[]
                            (&(this->_opts).super_Map<asl::String,_asl::String>,&opt);
        bVar1 = true;
        String::operator=(this_01,pSVar5 + iVar6);
      }
LAB_0013dbc0:
      String::~String(&opt);
      if (!bVar1) break;
    }
    else {
      bVar1 = String::startsWith(pSVar5 + iVar6,"--");
      pSVar5 = (this->_args)._a;
      if (bVar1) {
        if (pSVar5[iVar6]._size == 0) {
          paVar4 = &pSVar5[iVar6].field_2;
        }
        else {
          paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)pSVar5[iVar6].field_2._str;
        }
        if (((byte)(paVar4->_space[2] - 0x30U) < 10) ||
           ((byte)((paVar4->_space[2] & 0xdfU) + 0xbf) < 0x1a)) goto LAB_0013da5f;
      }
      bVar1 = String::operator!=(pSVar5 + iVar6,'-');
      if (bVar1) {
        Array<asl::String>::operator<<(&this->_rest,(this->_args)._a + iVar6);
      }
    }
    iVar6 = iVar6 + 1;
  }
  Array<asl::String>::~Array(&parts);
  Array<asl::String>::~Array(&options);
  Array<asl::String>::~Array(&flags);
  return;
}

Assistant:

void CmdArgs::parse(int argc, char* argv[], const String& spec)
{
	int n = abs(argc);
	for (int i = 0; i < n; i++)
	{
#ifdef _WIN32
		_args << ((argc < 0) ? String(argv[i]) : String::fromLocal(argv[i]));
#else
		_args << argv[i];
#endif
	}
	Array<String> flags;
	Array<String> options;
	Array<String> parts = spec.split(',');
	foreach(const String & s, parts)
	{
		if (s.contains(':'))
			options << s.substring(0, s.indexOf(':'));
		else
			flags << s;
	}
	for (int i = 1; i < _args.length(); i++)
	{
		if ((_args[i].startsWith('-') && myisalnum(_args[i][1])) || (_args[i].startsWith("--") && myisalnum(_args[i][2])))
		{
			bool isflag = _args[i].endsWith('!');
			String opt = _args[i].substring(1, _args[i].length() - (isflag ? 1 : 0));
			if (!_unused.contains(opt))
				_unused << opt;
			bool nextIsOption = i < _args.length() - 1 && ((_args[i + 1].startsWith('-') && myisalpha(_args[i + 1][1])) || (_args[i + 1].startsWith("--") && myisalpha(_args[i + 1][2])));
			if ((i < _args.length() - 1 && !nextIsOption) && !flags.contains(opt) && !isflag)
			{
				_multi[opt] << _args[i + 1];
				_opts[opt] = _args[i + 1];
				i++;
			}
			else if (isflag || !options.contains(opt))
			{
				_opts[opt] = "1";
			}
			else // option without value!
				return;
		}
		else if (_args[i] != '-')
			_rest << _args[i];
	}
}